

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gnuplot-iostream.h
# Opt level: O2

void gnuplotio::
     deref_and_print<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,int>,gnuplotio::ModeText>
               (ostream *stream,long *arg)

{
  long lVar1;
  long lVar2;
  size_t i;
  ulong uVar3;
  
  lVar2 = 0;
  for (uVar3 = 0; lVar1 = *arg, uVar3 < (ulong)(arg[1] - lVar1 >> 4); uVar3 = uVar3 + 1) {
    if (uVar3 != 0) {
      std::operator<<(stream," ");
      lVar1 = *arg;
    }
    deref_and_print<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,int>,gnuplotio::ModeText>
              (stream,lVar1 + lVar2);
    lVar2 = lVar2 + 0x10;
  }
  return;
}

Assistant:

void deref_and_print(std::ostream &stream, const VecOfRange<T> &arg, PrintMode) {
    if(PrintMode::is_binfmt && arg.rvec.empty()) throw plotting_empty_container();
    for(size_t i=0; i<arg.rvec.size(); i++) {
        if(i && PrintMode::is_text) stream << " ";
        deref_and_print(stream, arg.rvec[i], PrintMode());
    }
}